

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DoWhileStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3,Token *args_4,Token *args_5,ExpressionSyntax *args_6,Token *args_7
          ,Token *args_8)

{
  Token doKeyword;
  Token whileKeyword;
  Token openParen;
  Token closeParen;
  Token semi;
  DoWhileStatementSyntax *this_00;
  
  this_00 = (DoWhileStatementSyntax *)allocate(this,0xa8,8);
  doKeyword.kind = args_2->kind;
  doKeyword._2_1_ = args_2->field_0x2;
  doKeyword.numFlags.raw = (args_2->numFlags).raw;
  doKeyword.rawLen = args_2->rawLen;
  doKeyword.info = args_2->info;
  semi.kind = args_8->kind;
  semi._2_1_ = args_8->field_0x2;
  semi.numFlags.raw = (args_8->numFlags).raw;
  semi.rawLen = args_8->rawLen;
  semi.info = args_8->info;
  closeParen.kind = args_7->kind;
  closeParen._2_1_ = args_7->field_0x2;
  closeParen.numFlags.raw = (args_7->numFlags).raw;
  closeParen.rawLen = args_7->rawLen;
  closeParen.info = args_7->info;
  openParen.kind = args_5->kind;
  openParen._2_1_ = args_5->field_0x2;
  openParen.numFlags.raw = (args_5->numFlags).raw;
  openParen.rawLen = args_5->rawLen;
  openParen.info = args_5->info;
  whileKeyword.kind = args_4->kind;
  whileKeyword._2_1_ = args_4->field_0x2;
  whileKeyword.numFlags.raw = (args_4->numFlags).raw;
  whileKeyword.rawLen = args_4->rawLen;
  whileKeyword.info = args_4->info;
  slang::syntax::DoWhileStatementSyntax::DoWhileStatementSyntax
            (this_00,*args,args_1,doKeyword,args_3,whileKeyword,openParen,args_6,closeParen,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }